

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

int secp256k1_jacobi64_maybe_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  int i;
  int iVar1;
  long lVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int len;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar15;
  uint uVar16;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 g;
  ulong uVar14;
  
  f.v[4] = (modinfo->modulus).v[4];
  f.v[0] = (modinfo->modulus).v[0];
  f.v[1] = (modinfo->modulus).v[1];
  f.v[2] = (modinfo->modulus).v[2];
  f.v[3] = (modinfo->modulus).v[3];
  g.v[4] = x->v[4];
  g.v[0] = x->v[0];
  g.v[1] = x->v[1];
  g.v[2] = x->v[2];
  g.v[3] = x->v[3];
  lVar15 = -1;
  len = 5;
  uVar16 = 0;
  iVar8 = 0;
  do {
    if (iVar8 == 0x19) {
      return 0;
    }
    uVar12 = g.v[1] << 0x3e | g.v[0];
    t.v = 0;
    t.q = 0;
    t.u = 1;
    iVar1 = 0x3e;
    uVar6 = f.v[1] << 0x3e | f.v[0];
    t.r = t.u;
    while( true ) {
      uVar10 = -1L << ((byte)iVar1 & 0x3f) | uVar12;
      lVar2 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      bVar3 = (byte)lVar2;
      uVar12 = uVar12 >> (bVar3 & 0x3f);
      t.u = t.u << (bVar3 & 0x3f);
      t.v = t.v << (bVar3 & 0x3f);
      lVar15 = lVar15 - lVar2;
      uVar16 = ((uint)(uVar6 >> 1) ^ (uint)(uVar6 >> 2)) & (uint)lVar2 ^ uVar16;
      iVar1 = iVar1 - (uint)lVar2;
      if (iVar1 == 0) break;
      iVar9 = (int)uVar6;
      iVar11 = (int)uVar12;
      if (lVar15 < 0) {
        lVar15 = -lVar15;
        uVar16 = uVar16 ^ (uint)((uVar12 & uVar6) >> 1);
        iVar5 = (int)lVar15 + 1;
        cVar4 = (char)iVar5;
        if (iVar1 <= iVar5) {
          cVar4 = (char)iVar1;
        }
        uVar13 = (uint)(0xffffffffffffffff >> (-cVar4 & 0x3fU)) &
                 (iVar11 * iVar11 + 0x3e) * iVar11 * iVar9 & 0x3f;
        uVar10 = uVar12;
        lVar2 = t.v;
        lVar7 = t.u;
        t.v = t.r;
        t.u = t.q;
      }
      else {
        iVar5 = (int)lVar15 + 1;
        cVar4 = (char)iVar5;
        if (iVar1 <= iVar5) {
          cVar4 = (char)iVar1;
        }
        uVar13 = (uint)(0xffffffffffffffff >> (-cVar4 & 0x3fU)) &
                 -(iVar11 * ((iVar9 * 2 + 2U & 8) + iVar9)) & 0xf;
        uVar10 = uVar6;
        lVar2 = t.r;
        uVar6 = uVar12;
        lVar7 = t.q;
      }
      uVar14 = (ulong)uVar13;
      uVar12 = uVar14 * uVar10 + uVar6;
      t.q = t.u * uVar14 + lVar7;
      t.r = uVar14 * t.v + lVar2;
      uVar6 = uVar10;
    }
    secp256k1_modinv64_update_fg_62_var(len,&f,&g,&t);
    lVar2 = (long)len;
    if (f.v[0] == 1) {
      uVar6 = 0;
      for (lVar7 = 1; lVar7 < lVar2; lVar7 = lVar7 + 1) {
        uVar6 = uVar6 | f.v[lVar7];
      }
      if (uVar6 == 0) {
        return 1 - (uVar16 * 2 & 2);
      }
    }
    iVar1 = len + -1;
    if ((lVar2 + -2 < 0 || f.v[lVar2 + -1] != 0) || g.v[lVar2 + -1] != 0) {
      iVar1 = len;
    }
    len = iVar1;
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

static int secp256k1_jacobi64_maybe_var(const secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0);

    for (count = 0; count < JACOBI64_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 62 posdivsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_posdivsteps_62_var(eta, f.v[0] | ((uint64_t)f.v[1] << 62), g.v[0] | ((uint64_t)g.v[1] << 62), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. When f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1550 iterations. Return 0, indicating unknown result. */
    return 0;
}